

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkIvyStrash(Abc_Ntk_t *pNtk)

{
  Ivy_Man_t *pMan_00;
  Ivy_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  Abc_Ntk_t *pNtk_local;
  
  pMan_00 = Abc_NtkIvyBefore(pNtk,1,0);
  if (pMan_00 == (Ivy_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_local = Abc_NtkIvyAfter(pNtk,pMan_00,1,0);
    Ivy_ManStop(pMan_00);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyStrash( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkAig;
    Ivy_Man_t * pMan;
    pMan = Abc_NtkIvyBefore( pNtk, 1, 0 );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 1, 0 );
    Ivy_ManStop( pMan );
    return pNtkAig;
}